

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

int FmsTagSet(FmsTag tag,FmsIntType stored_tag_type,FmsIntType input_tag_type,void *ent_tags,
             FmsInt num_ents)

{
  int iVar1;
  void *dst;
  
  if (tag == (FmsTag)0x0) {
    return 1;
  }
  iVar1 = 2;
  if (((stored_tag_type < FMS_NUM_INT_TYPES) &&
      (iVar1 = 3, tag->tag_type == FMS_NUM_INT_TYPES || tag->tag_type == stored_tag_type)) &&
     (iVar1 = 4, input_tag_type < FMS_NUM_INT_TYPES)) {
    if (tag->comp == (FmsComponent)0x0) {
      iVar1 = 5;
    }
    else {
      iVar1 = 6;
      if ((tag->comp->num_main_entities == num_ents) &&
         (iVar1 = 7, ent_tags != (void *)0x0 || num_ents == 0)) {
        free(tag->tags);
        tag->tags = (void *)0x0;
        if (num_ents != 0) {
          dst = malloc(FmsIntTypeSize[stored_tag_type] * num_ents);
          tag->tags = dst;
          if (dst == (void *)0x0) {
            return 8;
          }
          FmsIntConvertCopy(input_tag_type,ent_tags,stored_tag_type,dst,num_ents);
        }
        tag->tag_type = stored_tag_type;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int FmsTagSet(FmsTag tag, FmsIntType stored_tag_type, FmsIntType input_tag_type,
              const void *ent_tags, FmsInt num_ents) {
  if (!tag) { E_RETURN(1); }
  if (stored_tag_type >= FMS_NUM_INT_TYPES) { E_RETURN(2); }
  if (tag->tag_type != FMS_NUM_INT_TYPES && tag->tag_type != stored_tag_type) {
    E_RETURN(3);
  }
  if (input_tag_type >= FMS_NUM_INT_TYPES) { E_RETURN(4); }
  FmsComponent comp = tag->comp;
  if (!comp) { E_RETURN(5); }
  if (comp->num_main_entities != num_ents) { E_RETURN(6); }
  if (num_ents != 0 && ent_tags == NULL) { E_RETURN(7); }
  free(tag->tags);
  tag->tags = NULL;
  if (num_ents != 0) {
    tag->tags = malloc(num_ents*FmsIntTypeSize[stored_tag_type]);
    if (tag->tags == NULL) { E_RETURN(8); }
    FmsIntConvertCopy(input_tag_type, ent_tags, stored_tag_type, tag->tags,
                      num_ents);
  }
  tag->tag_type = stored_tag_type;
  return 0;
}